

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O3

GLboolean glewGetExtension(char *name)

{
  uint uVar1;
  GLboolean GVar2;
  GLubyte *start;
  GLuint i;
  uint uVar3;
  
  start = (GLubyte *)glGetString(0x1f03);
  if (start != (GLubyte *)0x0) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      uVar1 = uVar3 + 1;
    } while (start[uVar3] != '\0');
    GVar2 = _glewSearchExtension(name,start,start + uVar3);
    return GVar2;
  }
  return '\0';
}

Assistant:

GLboolean GLEWAPIENTRY glewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;
  start = (const GLubyte*)glGetString(GL_EXTENSIONS);
  if (start == 0)
    return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}